

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O3

void __thiscall
Assimp::StreamWriter<false,_false>::Put<unsigned_short>
          (StreamWriter<false,_false> *this,unsigned_short f)

{
  size_t sVar1;
  pointer puVar2;
  
  sVar1 = this->cursor;
  puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <= sVar1 + 2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->buffer,sVar1 + 2);
    puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar1 = this->cursor;
  }
  *(unsigned_short *)(puVar2 + sVar1) = f;
  this->cursor = this->cursor + 2;
  return;
}

Assistant:

void Put(T f)   {
        Intern :: Getter<SwapEndianess,T,RuntimeSwitch>() (&f, le);

        if (cursor + sizeof(T) >= buffer.size()) {
            buffer.resize(cursor + sizeof(T));
        }

        void* dest = &buffer[cursor];

        // reinterpret_cast + assignment breaks strict aliasing rules
        // and generally causes trouble on platforms such as ARM that
        // do not silently ignore alignment faults.
        ::memcpy(dest, &f, sizeof(T));
        cursor += sizeof(T);
    }